

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

bool __thiscall
cashew::JSPrinter::needParens(JSPrinter *this,Ref parent,Ref child,int childPosition)

{
  bool bVar1;
  int prec;
  int iVar2;
  Value *this_00;
  Ref *pRVar3;
  Ref *pRVar4;
  int childPrecedence;
  int parentPrecedence;
  int childPosition_local;
  JSPrinter *this_local;
  Ref child_local;
  Ref parent_local;
  
  this_local = (JSPrinter *)child.inst;
  child_local = parent;
  prec = getPrecedence(this,parent,true);
  iVar2 = getPrecedence(this,(Ref)this_local,false);
  if (prec < iVar2) {
    return true;
  }
  if (iVar2 < prec) {
    return false;
  }
  this_00 = Ref::operator->(&child_local);
  bVar1 = cashew::Value::isArray(this_00);
  if (bVar1) {
    pRVar3 = Ref::operator[](&child_local,0);
    bVar1 = Ref::operator==(pRVar3,(IString *)UNARY_PREFIX);
    if (bVar1) {
      pRVar3 = Ref::operator[]((Ref *)&this_local,0);
      bVar1 = Ref::operator==(pRVar3,(IString *)UNARY_PREFIX);
      if (!bVar1) {
        __assert_fail("child[0] == UNARY_PREFIX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                      ,0x472,"bool cashew::JSPrinter::needParens(Ref, Ref, int)");
      }
      pRVar3 = Ref::operator[](&child_local,1);
      bVar1 = Ref::operator==(pRVar3,(IString *)&PLUS);
      if (!bVar1) {
        pRVar3 = Ref::operator[](&child_local,1);
        bVar1 = Ref::operator==(pRVar3,(IString *)&MINUS);
        if (!bVar1) goto LAB_0143e888;
      }
      pRVar3 = Ref::operator[]((Ref *)&this_local,1);
      pRVar4 = Ref::operator[](&child_local,1);
      bVar1 = Ref::operator==(pRVar3,pRVar4->inst);
      if (bVar1) {
        return true;
      }
    }
  }
LAB_0143e888:
  if (childPosition == 0) {
    parent_local.inst._7_1_ = true;
  }
  else if (iVar2 < 0) {
    parent_local.inst._7_1_ = false;
  }
  else {
    bVar1 = OperatorClass::getRtl(prec);
    if (bVar1) {
      parent_local.inst._7_1_ = childPosition < 0;
    }
    else {
      parent_local.inst._7_1_ = 0 < childPosition;
    }
  }
  return parent_local.inst._7_1_;
}

Assistant:

bool needParens(Ref parent, Ref child, int childPosition) {
    int parentPrecedence = getPrecedence(parent, true);
    int childPrecedence = getPrecedence(child, false);

    if (childPrecedence > parentPrecedence) {
      return true; // child is definitely a danger
    }
    if (childPrecedence < parentPrecedence) {
      return false; //          definitely cool
    }
    // equal precedence, so associativity (rtl/ltr) is what matters
    // (except for some exceptions, where multiple operators can combine into
    // confusion)
    if (parent->isArray() && parent[0] == UNARY_PREFIX) {
      assert(child[0] == UNARY_PREFIX);
      if ((parent[1] == PLUS || parent[1] == MINUS) && child[1] == parent[1]) {
        // cannot emit ++x when we mean +(+x)
        return true;
      }
    }
    if (childPosition == 0) {
      return true; // child could be anywhere, so always paren
    }
    if (childPrecedence < 0) {
      return false; // both precedences are safe
    }
    // check if child is on the dangerous side
    if (OperatorClass::getRtl(parentPrecedence)) {
      return childPosition < 0;
    } else {
      return childPosition > 0;
    }
  }